

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  ZSTD_paramSwitch_e useRowMatchFinder_00;
  size_t sVar1;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  ZSTD_paramSwitch_e useRowMatchFinder;
  size_t outBuffSize;
  size_t inBuffSize;
  size_t blockSize;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params *params_local;
  
  if (params->nbWorkers < 1) {
    cParams._20_8_ = params;
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_compressionParameters *)((long)&blockSize + 4),params,0xffffffffffffffff,0,
               ZSTD_cpm_noAttachDict);
    sVar1 = ZSTD_resolveMaxBlockSize(*(size_t *)(cParams._20_8_ + 0xc0));
    if (sVar1 < (ulong)(1L << (blockSize._4_1_ & 0x3f))) {
      local_60 = ZSTD_resolveMaxBlockSize(*(size_t *)(cParams._20_8_ + 0xc0));
    }
    else {
      local_60 = 1L << (blockSize._4_1_ & 0x3f);
    }
    if (*(int *)(cParams._20_8_ + 0x7c) == 0) {
      local_68 = (1L << (blockSize._4_1_ & 0x3f)) + local_60;
    }
    else {
      local_68 = 0;
    }
    if (*(int *)(cParams._20_8_ + 0x80) == 0) {
      local_70 = ZSTD_compressBound(local_60);
      local_70 = local_70 + 1;
    }
    else {
      local_70 = 0;
    }
    useRowMatchFinder_00 =
         ZSTD_resolveRowMatchFinderMode
                   (*(ZSTD_paramSwitch_e *)(cParams._20_8_ + 0x90),
                    (ZSTD_compressionParameters *)(cParams._20_8_ + 4));
    params_local = (ZSTD_CCtx_params *)
                   ZSTD_estimateCCtxSize_usingCCtxParams_internal
                             ((ZSTD_compressionParameters *)((long)&blockSize + 4),
                              (ldmParams_t *)(cParams._20_8_ + 0x60),1,useRowMatchFinder_00,local_68
                              ,local_70,0xffffffffffffffff,*(int *)(cParams._20_8_ + 0xb8),
                              *(size_t *)(cParams._20_8_ + 0xc0));
  }
  else {
    params_local = (ZSTD_CCtx_params *)0xffffffffffffffff;
  }
  return (size_t)params_local;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
        size_t const blockSize = MIN(ZSTD_resolveMaxBlockSize(params->maxBlockSize), (size_t)1 << cParams.windowLog);
        size_t const inBuffSize = (params->inBufferMode == ZSTD_bm_buffered)
                ? ((size_t)1 << cParams.windowLog) + blockSize
                : 0;
        size_t const outBuffSize = (params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder, &params->cParams);

        return ZSTD_estimateCCtxSize_usingCCtxParams_internal(
            &cParams, &params->ldmParams, 1, useRowMatchFinder, inBuffSize, outBuffSize,
            ZSTD_CONTENTSIZE_UNKNOWN, params->useSequenceProducer, params->maxBlockSize);
    }
}